

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lab1-1.cpp
# Opt level: O1

void SortThreeNumbers(int *a,int *b,int *c)

{
  int iVar1;
  int iVar2;
  int tmp_1;
  int tmp;
  
  do {
    while( true ) {
      iVar1 = *a;
      iVar2 = *b;
      if (iVar1 <= iVar2) break;
LAB_001011dc:
      *a = iVar2;
      *b = iVar1;
    }
    if (iVar2 <= *c) {
      return;
    }
    if (iVar2 < iVar1) goto LAB_001011dc;
    if (iVar2 <= *c) {
      return;
    }
    *b = *c;
    *c = iVar2;
  } while( true );
}

Assistant:

void SortThreeNumbers(int *a, int *b, int *c)
{
    while (*a > *b || *b > *c) {
        if (*a > *b) {
            int tmp = *a;
            *a = *b;
            *b = tmp;
        }
        else if (*b > *c)
        {
            int tmp = *b;
            *b = *c;
            *c = tmp;
        }
        else
        {
            break;
        }
    }
}